

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<13,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> res_2;
  Type in0;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  float local_88 [4];
  Matrix<float,_4,_2> local_78;
  float local_50 [4];
  float local_40 [4];
  float local_30 [5];
  undefined8 local_1c;
  undefined4 local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_78.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_78.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_78.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = -0.6;
    local_78.m_data.m_data[0].m_data[1] = -0.6;
    local_78.m_data.m_data[0].m_data[2] = -0.2;
    local_78.m_data.m_data[0].m_data[3] = -0.1;
    local_78.m_data.m_data[1].m_data[0] = -1.1;
    local_78.m_data.m_data[1].m_data[1] = -0.6;
    local_78.m_data.m_data[1].m_data[2] = -0.6;
    local_78.m_data.m_data[1].m_data[3] = -0.1;
  }
  local_30[0] = local_78.m_data.m_data[0].m_data[0];
  local_30[1] = local_78.m_data.m_data[0].m_data[1];
  local_30[2] = local_78.m_data.m_data[0].m_data[2];
  local_90 = CONCAT44(local_78.m_data.m_data[1].m_data[2],local_78.m_data.m_data[1].m_data[1]);
  local_88[0] = local_78.m_data.m_data[1].m_data[3];
  local_40[0] = 0.0;
  local_40[1] = 0.0;
  local_40[2] = 0.0;
  lVar1 = 0;
  do {
    local_40[lVar1] = local_30[lVar1] + *(float *)((long)&local_90 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,2>(&local_78);
  local_90._0_4_ = local_30[0];
  local_90._4_4_ = local_30[1];
  local_88[0] = local_30[2];
  local_a0 = local_1c;
  local_98 = local_14;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  local_50[2] = 0.0;
  lVar1 = 0;
  do {
    local_50[lVar1] =
         *(float *)((long)&local_90 + lVar1 * 4) + *(float *)((long)&local_a0 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_a0 = 0;
  local_98 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_a0 + lVar1 * 4) = local_40[lVar1] + local_50[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_88[0] = 0.0;
  local_88[1] = 1.4013e-45;
  local_88[2] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar1 * 4)] = afStack_a8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}